

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_ParseShortRepeatedUnknownEmpty_Test::
~TextFormatTest_ParseShortRepeatedUnknownEmpty_Test
          (TextFormatTest_ParseShortRepeatedUnknownEmpty_Test *this)

{
  TextFormatTest_ParseShortRepeatedUnknownEmpty_Test *this_local;
  
  ~TextFormatTest_ParseShortRepeatedUnknownEmpty_Test(this);
  operator_delete(this,0x3b0);
  return;
}

Assistant:

TEST_F(TextFormatTest, ParseShortRepeatedUnknownEmpty) {
  std::string parse_string =
      "repeated_string: \"before\"\n"
      "unknown_field: []\n"
      "repeated_string: \"after\"\n";
  TextFormat::Parser parser;
  parser.AllowUnknownField(true);

  ASSERT_TRUE(parser.ParseFromString(parse_string, &proto_));

  EXPECT_EQ(2, proto_.repeated_string_size());
}